

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::EnumFieldGenerator::GenerateExtensionCode
          (EnumFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  EnumFieldGenerator *this_local;
  
  WritePropertyDocComment
            (printer,(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.descriptor_);
  FieldGeneratorBase::AddDeprecatedFlag((FieldGeneratorBase *)this,printer);
  io::Printer::Print(printer,&(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.
                              variables_,
                     "$access_level$ static readonly pb::Extension<$extended_type$, $type_name$> $property_name$ =\n  new pb::Extension<$extended_type$, $type_name$>($number$, "
                    );
  (*(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.super_SourceGeneratorBase.
    _vptr_SourceGeneratorBase[4])(this,printer);
  io::Printer::Print<>(printer,");\n");
  return;
}

Assistant:

void EnumFieldGenerator::GenerateExtensionCode(io::Printer* printer) {
  WritePropertyDocComment(printer, descriptor_);
  AddDeprecatedFlag(printer);
  printer->Print(
    variables_,
    "$access_level$ static readonly pb::Extension<$extended_type$, $type_name$> $property_name$ =\n"
    "  new pb::Extension<$extended_type$, $type_name$>($number$, ");
  GenerateCodecCode(printer);
  printer->Print(");\n");
}